

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tok.c
# Opt level: O2

tokcxdef * tokcxini(errcxdef *errctx,mcmcxdef *mcmctx,tokldef *sctab)

{
  byte bVar1;
  int iVar2;
  tokcxdef *__s;
  size_t sVar3;
  char *pcVar4;
  ulong uVar5;
  int iVar6;
  tokscdef *ptVar7;
  uchar index [256];
  byte abStack_138 [264];
  
  iVar6 = 0;
  memset(abStack_138,0,0x100);
  iVar2 = 0x520;
  for (pcVar4 = sctab->toklstr; uVar5 = (ulong)(byte)*pcVar4, uVar5 != 0; pcVar4 = pcVar4 + 8) {
    if (abStack_138[uVar5] == 0) {
      iVar6 = iVar6 + 1;
      abStack_138[uVar5] = (byte)iVar6;
    }
    iVar2 = iVar2 + 0x18;
  }
  uVar5 = (ulong)(iVar2 + iVar6 * 8 & 0xfff8);
  __s = (tokcxdef *)mchalo(errctx,uVar5,"tokcxini");
  memset(__s,0,uVar5);
  memcpy(__s->tokcxinx,abStack_138,0x100);
  __s->tokcxerr = errctx;
  __s->tokcxmem = mcmctx;
  __s->tokcxifcur = 1;
  __s->tokcxptr = "";
  ptVar7 = (tokscdef *)(__s[1].tokcxmsav + (long)iVar6 + -10);
  for (pcVar4 = sctab->toklstr; bVar1 = *pcVar4, (ulong)bVar1 != 0; pcVar4 = pcVar4 + 8) {
    ptVar7->toksctyp = ((tokldef *)(pcVar4 + -4))->tokltyp;
    sVar3 = strlen(pcVar4);
    ptVar7->toksclen = (int)sVar3;
    memcpy(ptVar7->tokscstr,pcVar4,(long)(int)sVar3);
    bVar1 = abStack_138[bVar1];
    ptVar7->tokscnxt = __s->tokcxsc[bVar1];
    __s->tokcxsc[bVar1] = ptVar7;
    ptVar7 = ptVar7 + 1;
  }
  return __s;
}

Assistant:

tokcxdef *tokcxini(errcxdef *errctx, mcmcxdef *mcmctx, tokldef *sctab)
{
    int       i;
    int       cnt;
    tokldef  *p;
    uchar     c;
    uchar     index[256];
    tokcxdef *ret;
    tokscdef *sc;
    ushort    siz;
    
    /* set up index table: finds tokcxsc entry from character value */
    memset(index, 0, (size_t)sizeof(index));
    for (i = cnt = 0, p = sctab ; (c = p->toklstr[0]) != 0 ; ++cnt, ++p)
        if (!index[c]) index[c] = ++i;
    
    /* allocate memory for table plus the tokscdef's */
    siz = sizeof(tokcxdef) + (i * sizeof(tokscdef *))
          + ((cnt + 1) * sizeof(tokscdef));
    ret = (tokcxdef *)mchalo(errctx, siz, "tokcxini");
    memset(ret, 0, (size_t)siz);
    
    /* copy the index, set up fixed part */
    memcpy(ret->tokcxinx, index, sizeof(ret->tokcxinx));
    ret->tokcxerr = errctx;
    ret->tokcxmem = mcmctx;

    /* start out without an #if */
    ret->tokcxifcur = TOKIF_IF_YES;
    
    /* force the first toknext() to read a line */
    ret->tokcxptr = "\000";
    
    /* figure where the tokscdef's go (right after sc pointer array) */
    sc = (tokscdef *)&ret->tokcxsc[i+1];
    
    /* set up the individual tokscdef entries, and link into lists */
    for (p = sctab ; (c = p->toklstr[0]) != 0 ; ++p, ++sc)
    {
        size_t len;
        
        sc->toksctyp = p->tokltyp;
        len = sc->toksclen = strlen(p->toklstr);
        memcpy(sc->tokscstr, p->toklstr, len);
        sc->tokscnxt = ret->tokcxsc[index[c]];
        ret->tokcxsc[index[c]] = sc;
    }
    
    return(ret);
}